

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi-type-conversions.cpp
# Opt level: O1

void TestConversions<ompi_communicator_t_*,_diy::mpi::communicator>::Run(ompi_communicator_t *mt)

{
  communicator dc1;
  communicator cStack_38;
  communicator local_20;
  
  diy::mpi::communicator::communicator(&cStack_38,mt);
  diy::mpi::communicator::communicator(&local_20,mt);
  diy::mpi::communicator::~communicator(&local_20);
  diy::mpi::communicator::~communicator(&cStack_38);
  return;
}

Assistant:

static void Run(MPIType mt = MPIType{})
  {
    // test initialization
    DIYClass dc1 = mt;

    // can we pass MPIType object where an object of DIYHandle is expected?
    ExpectsDIYClass(mt);

    // test conversion operator
    MPIType mt2 = dc1;
    static_cast<void>(mt2);

    // can we pass DIYHandle object where an object of MPIType is expected?
    ExpectsMPIType(dc1);
  }